

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

value * mjs::json_stringify(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  pointer pvVar2;
  gc_heap *h;
  bool bVar3;
  uint32_t uVar4;
  long *plVar5;
  long *plVar6;
  gc_heap_ptr_untyped *pgVar7;
  undefined8 *puVar8;
  gc_heap_ptr_untyped *p;
  string *psVar9;
  wchar_t wVar10;
  uint32_t index;
  size_type __n;
  wchar_t wVar11;
  object_ptr *in_R9;
  uint uVar12;
  double dVar13;
  wstring_view wVar14;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_00;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_01;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_02;
  string class_name;
  anon_class_16_2_fd512dd5 insert_item;
  value item;
  object_ptr io;
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  object_ptr wrapper;
  stringify_state s;
  
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    value::value(__return_storage_ptr__,(value *)&value::undefined);
  }
  else {
    local_d8._16_8_ = __return_storage_ptr__;
    gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    global_object::make_object((global_object *)&wrapper);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&wrapper);
    plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar6 + 0x98))(&s,plVar6,"");
    (**(code **)(*plVar5 + 8))
              (plVar5,&s,
               (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&s);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&s,&global->super_gc_heap_ptr_untyped);
    s.indent_._M_dataplus._M_p = (pointer)&s.indent_.field_2;
    s.stack_.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    s.stack_.super_gc_heap_ptr_untyped.pos_ = 0;
    s.replacer_.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    s.replacer_.super_gc_heap_ptr_untyped.pos_ = 0;
    s.property_names_.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    s.property_names_.super_gc_heap_ptr_untyped.pos_ = 0;
    s.indent_._M_string_length = 0;
    s.indent_.field_2._M_local_buf[0] = L'\0';
    s.gap_._M_dataplus._M_p = (pointer)&s.gap_.field_2;
    s.gap_._M_string_length = 0;
    s.gap_.field_2._M_local_buf[0] = L'\0';
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pvVar1 == pvVar2) {
      __assert_fail("!args.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x1c9,
                    "mjs::(anonymous namespace)::stringify_state::stringify_state(const gc_heap_ptr<global_object> &, const std::vector<value> &)"
                   );
    }
    if ((1 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x28)) && (pvVar1[1].type_ == object)) {
      pgVar7 = &value::object_value(pvVar1 + 1)->super_gc_heap_ptr_untyped;
      bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>(pgVar7);
      if (bVar3) {
        gc_heap_ptr_untyped::operator=(&s.replacer_.super_gc_heap_ptr_untyped,pgVar7);
      }
      else {
        bVar3 = is_array((object_ptr *)pgVar7);
        h = s.global_.super_gc_heap_ptr_untyped.heap_;
        if (bVar3) {
          puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar7);
          io.super_gc_heap_ptr_untyped._8_8_ = L"length";
          io.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x6;
          (**(code **)*puVar8)(&item,puVar8);
          uVar4 = to_uint32(&item);
          value::~value(&item);
          gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::make
                    ((gc_heap *)&item,(uint32_t)h);
          gc_heap_ptr_untyped::operator=
                    (&s.property_names_.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)&item);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&item);
          insert_item.h = h;
          insert_item.this = &s;
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar7);
            index_string_abi_cxx11_((wstring *)&io,(mjs *)(ulong)uVar12,index);
            class_name.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                 (gc_heap *)io.super_gc_heap_ptr_untyped._8_8_;
            class_name.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ =
                 io.super_gc_heap_ptr_untyped.heap_;
            (**(code **)*puVar8)(&item,puVar8,&class_name);
            std::__cxx11::wstring::~wstring((wstring *)&io);
            if (item.type_ == number) {
              dVar13 = value::number_value(&item);
              to_string((mjs *)&io,h,dVar13);
              anon_unknown_46::stringify_state::stringify_state::anon_class_16_2_fd512dd5::
              operator()(&insert_item,(string *)&io);
LAB_0013bd56:
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&io);
            }
            else {
              if (item.type_ == object) {
                p = &value::object_value(&item)->super_gc_heap_ptr_untyped;
                gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&io,p);
                gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&io);
                object::class_name((object *)&class_name);
                wVar14 = string::view(&class_name);
                __y._M_str = L"String";
                __y._M_len = 6;
                bVar3 = std::operator==(wVar14,__y);
                if (bVar3) {
                  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&class_name);
                }
                else {
                  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&io);
                  object::class_name((object *)local_d8);
                  wVar14 = string::view((string *)local_d8);
                  __y_00._M_str = L"Number";
                  __y_00._M_len = 6;
                  bVar3 = std::operator==(wVar14,__y_00);
                  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d8);
                  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&class_name);
                  if (!bVar3) goto LAB_0013bd56;
                }
                to_string((mjs *)&class_name,h,&item);
                anon_unknown_46::stringify_state::stringify_state::anon_class_16_2_fd512dd5::
                operator()(&insert_item,&class_name);
                gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&class_name);
                goto LAB_0013bd56;
              }
              if (item.type_ == string) {
                psVar9 = value::string_value(&item);
                anon_unknown_46::stringify_state::stringify_state::anon_class_16_2_fd512dd5::
                operator()(&insert_item,psVar9);
              }
            }
            value::~value(&item);
          }
        }
      }
    }
    __return_storage_ptr__ = (value *)local_d8._16_8_;
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (2 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28)) {
      value::value(&item,pvVar1 + 2);
      if (item.type_ == object) {
        pgVar7 = &value::object_value(&item)->super_gc_heap_ptr_untyped;
        gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&insert_item,pgVar7);
        gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&insert_item);
        object::class_name((object *)&class_name);
        wVar14 = string::view(&class_name);
        __y_01._M_str = L"Number";
        __y_01._M_len = 6;
        bVar3 = std::operator==(wVar14,__y_01);
        if (bVar3) {
          dVar13 = to_number(&item);
          io.super_gc_heap_ptr_untyped.heap_._0_4_ = 3;
          io.super_gc_heap_ptr_untyped._8_8_ = dVar13;
          value::operator=(&item,(value *)&io);
          value::~value((value *)&io);
        }
        else {
          wVar14 = string::view(&class_name);
          __y_02._M_str = L"String";
          __y_02._M_len = 6;
          bVar3 = std::operator==(wVar14,__y_02);
          if (bVar3) {
            to_string((mjs *)local_d8,s.global_.super_gc_heap_ptr_untyped.heap_,&item);
            value::value((value *)&io,(string *)local_d8);
            value::operator=(&item,(value *)&io);
            value::~value((value *)&io);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d8);
          }
        }
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&class_name);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&insert_item);
      }
      if (item.type_ == string) {
        psVar9 = value::string_value(&item);
        io.super_gc_heap_ptr_untyped = (gc_heap_ptr_untyped)string::view(psVar9);
        __n = 10;
        if (io.super_gc_heap_ptr_untyped.heap_ < 10) {
          __n = (size_type)io.super_gc_heap_ptr_untyped.heap_;
        }
        insert_item = (anon_class_16_2_fd512dd5)
                      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&io,0,__n
                                );
        std::__cxx11::wstring::assign<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                  ((wstring *)&s.gap_,
                   (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&insert_item);
      }
      else if (item.type_ == number) {
        dVar13 = value::number_value(&item);
        dVar13 = to_integer(dVar13);
        wVar10 = L'\n';
        if ((int)dVar13 < L'\n') {
          wVar10 = (int)dVar13;
        }
        wVar11 = L'\0';
        if (L'\0' < wVar10) {
          wVar11 = wVar10;
        }
        io.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_f0;
        std::__cxx11::wstring::_M_construct((ulong)&io,wVar11);
        std::__cxx11::wstring::operator=((wstring *)&s.gap_,(wstring *)&io);
        std::__cxx11::wstring::~wstring((wstring *)&io);
      }
      value::~value(&item);
    }
    wVar14._M_str = (wchar_t *)&wrapper;
    wVar14._M_len = (size_t)L"";
    anon_unknown_46::json_str
              (__return_storage_ptr__,(anon_unknown_46 *)&s,(stringify_state *)0x0,wVar14,in_R9);
    anon_unknown_46::stringify_state::~stringify_state(&s);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&wrapper.super_gc_heap_ptr_untyped);
  }
  return __return_storage_ptr__;
}

Assistant:

value json_stringify(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    if (args.empty()) {
        return value::undefined;
    }

    auto wrapper = global->make_object();
    wrapper->put(global->common_string(""), args.front());

    stringify_state s{global, args};

    return json_str(s, L"", wrapper);
}